

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folded_integer_bit_encoder.h
# Opt level: O2

void __thiscall
draco::FoldedBit32Encoder<draco::RAnsBitEncoder>::EncodeLeastSignificantBits32
          (FoldedBit32Encoder<draco::RAnsBitEncoder> *this,int nbits,uint32_t value)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar1 = 1 << ((char)nbits - 1U & 0x1f);
  uVar2 = 0;
  if (0 < nbits) {
    uVar2 = (ulong)(uint)nbits;
  }
  while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
    RAnsBitEncoder::EncodeBit((RAnsBitEncoder *)this,(uVar1 & value) != 0);
    uVar1 = uVar1 >> 1;
    this = (FoldedBit32Encoder<draco::RAnsBitEncoder> *)&(this->folded_number_encoders_).field_0x38;
  }
  return;
}

Assistant:

void EncodeLeastSignificantBits32(int nbits, uint32_t value) {
    uint32_t selector = 1 << (nbits - 1);
    for (int i = 0; i < nbits; i++) {
      const bool bit = (value & selector);
      folded_number_encoders_[i].EncodeBit(bit);
      selector = selector >> 1;
    }
  }